

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine_test.cpp
# Opt level: O0

void __thiscall
ram::test::RamMinimizerEngineTest_Map_Test::TestBody(RamMinimizerEngineTest_Map_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  reference pvVar4;
  char *pcVar5;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  *this_00;
  string local_5e0;
  AssertHelper local_5c0;
  Message local_5b8;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__3;
  Message local_598;
  int local_58c;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_23;
  Message local_570;
  int local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_22;
  Message local_548;
  int local_53c;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_21;
  Message local_520;
  int local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_20;
  Message local_4f8;
  int local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_19;
  Message local_4d0;
  int local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_18;
  Message local_4a8;
  int local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_17;
  Message local_480;
  size_type local_478;
  int local_46c;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_16;
  string local_440;
  AssertHelper local_420;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__2;
  Message local_3f8;
  int local_3ec;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_15;
  Message local_3d0;
  int local_3c4;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_14;
  Message local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_13;
  Message local_380;
  int local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_12;
  Message local_358;
  int local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_11;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_10;
  Message local_308;
  int local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_9;
  Message local_2e0;
  size_type local_2d8;
  int local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_8;
  string local_2a0;
  AssertHelper local_280;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__1;
  string local_240;
  AssertHelper local_220;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_7;
  Message local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_6;
  Message local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_5;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_4;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0;
  size_type local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> o;
  const_iterator local_98;
  __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
  local_90;
  const_iterator local_88;
  shared_ptr<thread_pool::ThreadPool> local_70;
  undefined1 local_60 [8];
  MinimizerEngine me;
  RamMinimizerEngineTest_Map_Test *this_local;
  
  me.thread_pool_.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::shared_ptr<thread_pool::ThreadPool>::shared_ptr(&local_70,(nullptr_t)0x0);
  MinimizerEngine::MinimizerEngine((MinimizerEngine *)local_60,&local_70,0xf,5,500,4,100,10000);
  std::shared_ptr<thread_pool::ThreadPool>::~shared_ptr(&local_70);
  this_00 = &(this->super_RamMinimizerEngineTest).s;
  local_90._M_current =
       (unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_> *)
       std::
       vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
       ::begin(this_00);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
  ::
  __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>*>
            ((__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
              *)&local_88,&local_90);
  o.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                ::end(this_00);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
  ::
  __normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>*>
            ((__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const*,std::vector<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>,std::allocator<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>>>>
              *)&local_98,
             (__normal_iterator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_*,_std::vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>_>
              *)&o.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  MinimizerEngine::Minimize((MinimizerEngine *)local_60,local_88,local_98,false);
  MinimizerEngine::Filter((MinimizerEngine *)local_60,0.001);
  pvVar2 = std::
           vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
           ::front(&(this->super_RamMinimizerEngineTest).s);
  pcVar5 = (char *)0x0;
  MinimizerEngine::Map
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar.message_,
             (MinimizerEngine *)local_60,pvVar2,true,true,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  local_cc = 1;
  local_d8 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::size
                       ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                        &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_c8,"1","o.size()",&local_cc,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_fc = 0;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_f8,"0","o.front().lhs_id",&local_fc,&pvVar4->lhs_id);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_124 = 0x1e;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_120,"30","o.front().lhs_begin",&local_124,&pvVar4->lhs_begin);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_14c = 0x74d;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_148,"1869","o.front().lhs_end",&local_14c,&pvVar4->lhs_end);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_174 = 1;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_170,"1","o.front().rhs_id",&local_174,&pvVar4->rhs_id);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_19c = 0;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_198,"0","o.front().rhs_begin",&local_19c,&pvVar4->rhs_begin);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1c4 = 0x765;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1c0,"1893","o.front().rhs_end",&local_1c4,&pvVar4->rhs_end);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_1ec = 0x249;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1e8,"585","o.front().score",&local_1ec,&pvVar4->score);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&pvVar4->strand,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)local_210,(AssertionResult *)"o.front().strand","false","true"
               ,pcVar5);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x27,pcVar5);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  pvVar2 = std::
           vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
           ::back(&(this->super_RamMinimizerEngineTest).s);
  pcVar5 = (char *)0x0;
  MinimizerEngine::Map
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar__1.message_,
             (MinimizerEngine *)local_60,pvVar2,true,true,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::operator=
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar.message_,
             (vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar__1.message_);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar__1.message_);
  local_269 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::empty
                        ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                         &gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,&local_269,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2a0,(internal *)local_268,(AssertionResult *)"o.empty()","false","true",pcVar5
              );
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  pvVar2 = std::
           vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
           ::back(&(this->super_RamMinimizerEngineTest).s);
  pcVar5 = (char *)0x0;
  MinimizerEngine::Map
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar_8.message_,
             (MinimizerEngine *)local_60,pvVar2,true,false,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::operator=
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar.message_,
             (vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar_8.message_);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar_8.message_);
  local_2cc = 1;
  local_2d8 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::size
                        ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                         &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_2c8,"1","o.size()",&local_2cc,&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_2fc = 1;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2f8,"1","o.front().lhs_id",&local_2fc,&pvVar4->lhs_id);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  local_324 = 0;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_320,"0","o.front().lhs_begin",&local_324,&pvVar4->lhs_begin);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_34c = 0x765;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_348,"1893","o.front().lhs_end",&local_34c,&pvVar4->lhs_end);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_374 = 0;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_370,"0","o.front().rhs_id",&local_374,&pvVar4->rhs_id);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_39c = 0x1e;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_398,"30","o.front().rhs_begin",&local_39c,&pvVar4->rhs_begin);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3c4 = 0x74d;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_3c0,"1869","o.front().rhs_end",&local_3c4,&pvVar4->rhs_end);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_3ec = 0x249;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_3e8,"585","o.front().score",&local_3ec,&pvVar4->score);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_410,&pvVar4->strand,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,(internal *)local_410,(AssertionResult *)"o.front().strand","false","true"
               ,pcVar5);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x35,pcVar5);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  pvVar2 = std::
           vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
           ::front(&(this->super_RamMinimizerEngineTest).s);
  pcVar5 = (char *)0x0;
  MinimizerEngine::Map
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar_16.message_,
             (MinimizerEngine *)local_60,pvVar2,false,true,false,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::operator=
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar.message_,
             (vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar_16.message_);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar_16.message_);
  local_46c = 2;
  local_478 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::size
                        ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                         &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_468,"2","o.size()",&local_46c,&local_478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_49c = 0;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_498,"0","o.front().lhs_id",&local_49c,&pvVar4->lhs_id);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  local_4c4 = 2;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_4c0,"2","o.front().lhs_begin",&local_4c4,&pvVar4->lhs_begin);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_4ec = 0x769;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_4e8,"1897","o.front().lhs_end",&local_4ec,&pvVar4->lhs_end);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  local_514 = 0;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_510,"0","o.front().rhs_id",&local_514,&pvVar4->rhs_id);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  local_53c = 2;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_538,"2","o.front().rhs_begin",&local_53c,&pvVar4->rhs_begin);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  local_564 = 0x769;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_560,"1897","o.front().rhs_end",&local_564,&pvVar4->rhs_end);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  local_58c = 0x767;
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_588,"1895","o.front().score",&local_58c,&pvVar4->score);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  pvVar4 = std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::front
                     ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)
                      &gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&pvVar4->strand,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5e0,(internal *)local_5b0,(AssertionResult *)"o.front().strand","false","true"
               ,pcVar5);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/lbcb-sci[P]ram/test/minimizer_engine_test.cpp"
               ,0x40,pcVar5);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector
            ((vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> *)&gtest_ar.message_);
  MinimizerEngine::~MinimizerEngine((MinimizerEngine *)local_60);
  return;
}

Assistant:

TEST_F(RamMinimizerEngineTest, Map) {
  MinimizerEngine me{};
  me.Minimize(s.begin(), s.end());
  me.Filter(0.001);

  auto o = me.Map(s.front(), true, true);
  EXPECT_EQ(1, o.size());
  EXPECT_EQ(0, o.front().lhs_id);
  EXPECT_EQ(30, o.front().lhs_begin);
  EXPECT_EQ(1869, o.front().lhs_end);
  EXPECT_EQ(1, o.front().rhs_id);
  EXPECT_EQ(0, o.front().rhs_begin);
  EXPECT_EQ(1893, o.front().rhs_end);
  EXPECT_EQ(585, o.front().score);
  EXPECT_TRUE(o.front().strand);

  o = me.Map(s.back(), true, true);
  EXPECT_TRUE(o.empty());

  o = me.Map(s.back(), true, false);
  EXPECT_EQ(1, o.size());
  EXPECT_EQ(1, o.front().lhs_id);
  EXPECT_EQ(0, o.front().lhs_begin);
  EXPECT_EQ(1893, o.front().lhs_end);
  EXPECT_EQ(0, o.front().rhs_id);
  EXPECT_EQ(30, o.front().rhs_begin);
  EXPECT_EQ(1869, o.front().rhs_end);
  EXPECT_EQ(585, o.front().score);
  EXPECT_TRUE(o.front().strand);

  o = me.Map(s.front(), false, true);
  EXPECT_EQ(2, o.size());
  EXPECT_EQ(0, o.front().lhs_id);
  EXPECT_EQ(2, o.front().lhs_begin);
  EXPECT_EQ(1897, o.front().lhs_end);
  EXPECT_EQ(0, o.front().rhs_id);
  EXPECT_EQ(2, o.front().rhs_begin);
  EXPECT_EQ(1897, o.front().rhs_end);
  EXPECT_EQ(1895, o.front().score);
  EXPECT_TRUE(o.front().strand);
}